

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_dense.c
# Opt level: O0

void denseGETRS(realtype **a,sunindextype n,sunindextype *p,realtype *b)

{
  realtype rVar1;
  long lVar2;
  realtype *prVar3;
  realtype tmp;
  realtype *col_k;
  sunindextype pk;
  sunindextype k;
  sunindextype i;
  realtype *b_local;
  sunindextype *p_local;
  sunindextype n_local;
  realtype **a_local;
  
  for (pk = 0; pk < n; pk = pk + 1) {
    lVar2 = p[pk];
    if (lVar2 != pk) {
      rVar1 = b[pk];
      b[pk] = b[lVar2];
      b[lVar2] = rVar1;
    }
  }
  for (pk = 0; pk < n + -1; pk = pk + 1) {
    prVar3 = a[pk];
    k = pk;
    while (k = k + 1, k < n) {
      b[k] = -prVar3[k] * b[pk] + b[k];
    }
  }
  for (pk = n + -1; 0 < pk; pk = pk + -1) {
    prVar3 = a[pk];
    b[pk] = b[pk] / prVar3[pk];
    for (k = 0; k < pk; k = k + 1) {
      b[k] = -prVar3[k] * b[pk] + b[k];
    }
  }
  *b = *b / **a;
  return;
}

Assistant:

void denseGETRS(realtype **a, sunindextype n, sunindextype *p, realtype *b)
{
  sunindextype i, k, pk;
  realtype *col_k, tmp;

  /* Permute b, based on pivot information in p */
  for (k=0; k<n; k++) {
    pk = p[k];
    if(pk != k) {
      tmp = b[k];
      b[k] = b[pk];
      b[pk] = tmp;
    }
  }

  /* Solve Ly = b, store solution y in b */
  for (k=0; k<n-1; k++) {
    col_k = a[k];
    for (i=k+1; i<n; i++) b[i] -= col_k[i]*b[k];
  }

  /* Solve Ux = y, store solution x in b */
  for (k = n-1; k > 0; k--) {
    col_k = a[k];
    b[k] /= col_k[k];
    for (i=0; i<k; i++) b[i] -= col_k[i]*b[k];
  }
  b[0] /= a[0][0];

}